

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

xmlChar * htmlParseHTMLName_nonInvasive(htmlParserCtxtPtr ctxt)

{
  bool bVar1;
  xmlChar local_88 [8];
  xmlChar loc [100];
  int local_1c;
  int i;
  htmlParserCtxtPtr ctxt_local;
  
  local_1c = 0;
  if ((((ctxt->input->cur[1] < 0x41) || (0x5a < ctxt->input->cur[1])) &&
      ((ctxt->input->cur[1] < 0x61 || (0x7a < ctxt->input->cur[1])))) &&
     ((ctxt->input->cur[1] != '_' && (ctxt->input->cur[1] != ':')))) {
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  else {
    while( true ) {
      bVar1 = false;
      if (((local_1c < 100) &&
          (((ctxt->input->cur[local_1c + 1] < 0x41 ||
            (bVar1 = true, 0x5a < ctxt->input->cur[local_1c + 1])) &&
           ((ctxt->input->cur[local_1c + 1] < 0x61 ||
            (bVar1 = true, 0x7a < ctxt->input->cur[local_1c + 1])))))) &&
         ((((ctxt->input->cur[local_1c + 1] < 0x30 ||
            (bVar1 = true, 0x39 < ctxt->input->cur[local_1c + 1])) &&
           (bVar1 = true, ctxt->input->cur[local_1c + 1] != ':')) &&
          (bVar1 = true, ctxt->input->cur[local_1c + 1] != '-')))) {
        bVar1 = ctxt->input->cur[local_1c + 1] == '_';
      }
      if (!bVar1) break;
      if ((ctxt->input->cur[local_1c + 1] < 0x41) || (0x5a < ctxt->input->cur[local_1c + 1])) {
        local_88[local_1c] = ctxt->input->cur[local_1c + 1];
      }
      else {
        local_88[local_1c] = ctxt->input->cur[local_1c + 1] + ' ';
      }
      local_1c = local_1c + 1;
    }
    ctxt_local = (htmlParserCtxtPtr)xmlDictLookup(ctxt->dict,local_88,local_1c);
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static const xmlChar *
htmlParseHTMLName_nonInvasive(htmlParserCtxtPtr ctxt) {
    int i = 0;
    xmlChar loc[HTML_PARSER_BUFFER_SIZE];

    if (!IS_ASCII_LETTER(NXT(1)) && (NXT(1) != '_') &&
        (NXT(1) != ':')) return(NULL);

    while ((i < HTML_PARSER_BUFFER_SIZE) &&
           ((IS_ASCII_LETTER(NXT(1+i))) || (IS_ASCII_DIGIT(NXT(1+i))) ||
	   (NXT(1+i) == ':') || (NXT(1+i) == '-') || (NXT(1+i) == '_'))) {
	if ((NXT(1+i) >= 'A') && (NXT(1+i) <= 'Z')) loc[i] = NXT(1+i) + 0x20;
        else loc[i] = NXT(1+i);
	i++;
    }

    return(xmlDictLookup(ctxt->dict, loc, i));
}